

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O1

bool __thiscall tinygltf::Image::operator==(Image *this,Image *other)

{
  pointer __s1;
  pointer puVar1;
  pointer __s2;
  bool bVar2;
  __type _Var3;
  int iVar4;
  size_t __n;
  
  if (this->bufferView != other->bufferView) {
    return false;
  }
  if ((((this->component == other->component) &&
       ((this->extensions)._M_t._M_impl.super__Rb_tree_header._M_node_count ==
        (other->extensions)._M_t._M_impl.super__Rb_tree_header._M_node_count)) &&
      (bVar2 = std::__equal<false>::
               equal<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,tinygltf::Value>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,tinygltf::Value>>>
                         ((this->extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                          (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>
                           )&(this->extensions)._M_t._M_impl.super__Rb_tree_header,
                          (other->extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left),
      bVar2)) &&
     ((bVar2 = Equals(&this->extras,&other->extras), bVar2 && (this->height == other->height)))) {
    __s1 = (this->image).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
    puVar1 = (this->image).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_finish;
    __n = (long)puVar1 - (long)__s1;
    __s2 = (other->image).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
    if ((((__n == (long)(other->image).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)__s2) &&
         ((puVar1 == __s1 || (iVar4 = bcmp(__s1,__s2,__n), iVar4 == 0)))) &&
        (_Var3 = std::operator==(&this->mimeType,&other->mimeType), _Var3)) &&
       ((_Var3 = std::operator==(&this->name,&other->name), _Var3 &&
        (_Var3 = std::operator==(&this->uri,&other->uri), _Var3)))) {
      return this->width == other->width;
    }
  }
  return false;
}

Assistant:

bool Image::operator==(const Image &other) const {
  return this->bufferView == other.bufferView &&
         this->component == other.component &&
         this->extensions == other.extensions && this->extras == other.extras &&
         this->height == other.height && this->image == other.image &&
         this->mimeType == other.mimeType && this->name == other.name &&
         this->uri == other.uri && this->width == other.width;
}